

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::missingArgsException(CmdLine *this)

{
  bool bVar1;
  uint uVar2;
  reference ppAVar3;
  string *psVar4;
  undefined8 uVar5;
  string *in_stack_00000050;
  string *in_stack_00000058;
  string msg;
  ArgListIterator it;
  string missingArgList;
  int count;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_98 [32];
  string local_78 [32];
  _List_node_base *local_58;
  _Self local_40;
  _Self local_38;
  string local_30 [36];
  int local_c;
  
  local_c = 0;
  std::__cxx11::string::string(local_30);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 (in_stack_ffffffffffffff08);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   (in_stack_ffffffffffffff08);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x19328b)
    ;
    uVar2 = (*(*ppAVar3)->_vptr_Arg[5])();
    if ((uVar2 & 1) != 0) {
      ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*
                          ((_List_iterator<TCLAP::Arg_*> *)0x1932b7);
      bVar1 = Arg::isSet(*ppAVar3);
      if (!bVar1) {
        ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*
                            ((_List_iterator<TCLAP::Arg_*> *)0x1932d0);
        psVar4 = Arg::getName_abi_cxx11_(*ppAVar3);
        std::__cxx11::string::operator+=(local_30,(string *)psVar4);
        std::__cxx11::string::operator+=(local_30,", ");
        local_c = local_c + 1;
      }
    }
    local_58 = (_List_node_base *)std::_List_iterator<TCLAP::Arg_*>::operator++(&local_38,0);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_30);
  std::__cxx11::string::operator=(local_30,local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::string(local_98);
  if (local_c < 2) {
    std::__cxx11::string::operator=(local_98,"Required argument missing: ");
  }
  else {
    std::__cxx11::string::operator=(local_98,"Required arguments missing: ");
  }
  std::__cxx11::string::operator+=(local_98,local_30);
  uVar6 = 1;
  uVar5 = __cxa_allocate_exception(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar6,in_stack_ffffffffffffff40)));
  CmdLineParseException::CmdLineParseException
            ((CmdLineParseException *)msg._0_8_,in_stack_00000058,in_stack_00000050);
  __cxa_throw(uVar5,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException);
}

Assistant:

inline void CmdLine::missingArgsException()
{
		int count = 0;

		std::string missingArgList;
		for (ArgListIterator it = _argList.begin(); it != _argList.end(); it++)
		{
			if ( (*it)->isRequired() && !(*it)->isSet() )
			{
				missingArgList += (*it)->getName();
				missingArgList += ", ";
				count++;
			}
		}
		missingArgList = missingArgList.substr(0,missingArgList.length()-2);

		std::string msg;
		if ( count > 1 )
			msg = "Required arguments missing: ";
		else
			msg = "Required argument missing: ";

		msg += missingArgList;

		throw(CmdLineParseException(msg));
}